

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_BasicInequivalencyNonSetTest_Test::TestBody
          (MessageDifferencerTest_BasicInequivalencyNonSetTest_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_6e8;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_690 [8];
  TestAllTypes msg2;
  TestAllTypes msg1;
  MessageDifferencerTest_BasicInequivalencyNonSetTest_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::set_optional_int32
            ((TestAllTypes *)((long)&msg2.field_0 + 0x328),-1);
  bVar1 = util::MessageDifferencer::Equivalent
                    ((Message *)((long)&msg2.field_0 + 0x328),(Message *)local_690);
  local_6b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6e8,(internal *)local_6b0,
               (AssertionResult *)"util::MessageDifferencer::Equivalent(msg1, msg2)","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x2ef,message);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&msg2.field_0 + 0x328));
  return;
}

Assistant:

TEST(MessageDifferencerTest, BasicInequivalencyNonSetTest) {
  // Create the testing protos
  unittest::TestAllTypes msg1;
  unittest::TestAllTypes msg2;

  msg1.set_optional_int32(-1);

  // Compare
  EXPECT_FALSE(util::MessageDifferencer::Equivalent(msg1, msg2));
}